

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O3

bool QtPrivate::QLessThanOperatorForType<QDBusObjectPath,_true>::lessThan
               (QMetaTypeInterface *param_1,void *a,void *b)

{
  QArrayData *pQVar1;
  storage_type_conflict *psVar2;
  qsizetype qVar3;
  QArrayData *pQVar4;
  storage_type_conflict *psVar5;
  qsizetype qVar6;
  byte extraout_var;
  byte extraout_var_00;
  byte bVar7;
  QStringView QVar8;
  QStringView QVar9;
  QStringView QVar10;
  QStringView QVar11;
  
  pQVar1 = *a;
  psVar2 = *(storage_type_conflict **)((long)a + 8);
  qVar3 = *(qsizetype *)((long)a + 0x10);
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pQVar4 = *b;
  psVar5 = *(storage_type_conflict **)((long)b + 8);
  qVar6 = *(qsizetype *)((long)b + 0x10);
  if (pQVar4 == (QArrayData *)0x0) {
    QVar9.m_data = psVar2;
    QVar9.m_size = qVar3;
    QVar11.m_data = psVar5;
    QVar11.m_size = qVar6;
    QtPrivate::compareStrings(QVar9,QVar11,CaseSensitive);
    bVar7 = extraout_var_00;
  }
  else {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    QVar8.m_data = psVar2;
    QVar8.m_size = qVar3;
    QVar10.m_data = psVar5;
    QVar10.m_size = qVar6;
    QtPrivate::compareStrings(QVar8,QVar10,CaseSensitive);
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    bVar7 = extraout_var;
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar4,2,0x10);
    }
  }
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,0x10);
    }
  }
  return (bool)(bVar7 >> 7);
}

Assistant:

static bool lessThan(const QMetaTypeInterface *, const void *a, const void *b)
    { return *reinterpret_cast<const T *>(a) < *reinterpret_cast<const T *>(b); }